

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

WebPIDecoder *
WebPINewYUVA(uint8_t *luma,size_t luma_size,int luma_stride,uint8_t *u,size_t u_size,int u_stride,
            uint8_t *v,size_t v_size,int v_stride,uint8_t *a,size_t a_size,int a_stride)

{
  uint8_t *in_RCX;
  int in_EDX;
  size_t in_RSI;
  uint8_t *in_RDI;
  size_t in_R8;
  int in_R9D;
  WEBP_CSP_MODE colorspace;
  WebPIDecoder *idec;
  int is_external_memory;
  undefined4 in_stack_00000028;
  WEBP_CSP_MODE local_44;
  int local_34;
  size_t local_30;
  uint8_t *local_28;
  int local_1c;
  size_t local_18;
  WebPIDecoder *local_8;
  
  if ((in_RDI != (uint8_t *)0x0) == 0) {
    _in_stack_00000028 = 0;
    _is_external_memory = 0;
    local_30 = 0;
    local_18 = 0;
    luma_size._0_4_ = 0;
    u_size._0_4_ = 0;
    local_34 = 0;
    local_1c = 0;
    u = (uint8_t *)0x0;
    idec = (WebPIDecoder *)0x0;
    local_28 = (uint8_t *)0x0;
    local_44 = MODE_YUVA;
  }
  else {
    if ((in_RCX == (uint8_t *)0x0) || (idec == (WebPIDecoder *)0x0)) {
      return (WebPIDecoder *)0x0;
    }
    if (((in_RSI == 0) || (in_R8 == 0)) || (_is_external_memory == 0)) {
      return (WebPIDecoder *)0x0;
    }
    if (((in_EDX == 0) || (in_R9D == 0)) || ((int)u_size == 0)) {
      return (WebPIDecoder *)0x0;
    }
    if ((u != (uint8_t *)0x0) && ((_in_stack_00000028 == 0 || ((int)luma_size == 0)))) {
      return (WebPIDecoder *)0x0;
    }
    local_44 = MODE_YUVA;
    local_34 = in_R9D;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    if (u == (uint8_t *)0x0) {
      local_44 = MODE_YUV;
    }
  }
  local_8 = WebPINewDecoder((WebPDecBuffer *)0x10b878);
  if (local_8 == (WebPIDecoder *)0x0) {
    local_8 = (WebPIDecoder *)0x0;
  }
  else {
    (local_8->output_).colorspace = local_44;
    (local_8->output_).is_external_memory = (uint)(in_RDI != (uint8_t *)0x0);
    (local_8->output_).u.RGBA.rgba = in_RDI;
    (local_8->output_).u.YUVA.y_stride = local_1c;
    (local_8->output_).u.YUVA.y_size = local_18;
    (local_8->output_).u.YUVA.u = local_28;
    (local_8->output_).u.YUVA.u_stride = local_34;
    (local_8->output_).u.YUVA.u_size = local_30;
    (local_8->output_).u.YUVA.v = (uint8_t *)idec;
    (local_8->output_).u.YUVA.v_stride = (int)u_size;
    (local_8->output_).u.YUVA.v_size = _is_external_memory;
    (local_8->output_).u.YUVA.a = u;
    (local_8->output_).u.YUVA.a_stride = (int)luma_size;
    (local_8->output_).u.YUVA.a_size = _in_stack_00000028;
  }
  return local_8;
}

Assistant:

WebPIDecoder* WebPINewYUVA(uint8_t* luma, size_t luma_size, int luma_stride,
                           uint8_t* u, size_t u_size, int u_stride,
                           uint8_t* v, size_t v_size, int v_stride,
                           uint8_t* a, size_t a_size, int a_stride) {
  const int is_external_memory = (luma != NULL) ? 1 : 0;
  WebPIDecoder* idec;
  WEBP_CSP_MODE colorspace;

  if (is_external_memory == 0) {    // Overwrite parameters to sane values.
    luma_size = u_size = v_size = a_size = 0;
    luma_stride = u_stride = v_stride = a_stride = 0;
    u = v = a = NULL;
    colorspace = MODE_YUVA;
  } else {  // A luma buffer was passed. Validate the other parameters.
    if (u == NULL || v == NULL) return NULL;
    if (luma_size == 0 || u_size == 0 || v_size == 0) return NULL;
    if (luma_stride == 0 || u_stride == 0 || v_stride == 0) return NULL;
    if (a != NULL) {
      if (a_size == 0 || a_stride == 0) return NULL;
    }
    colorspace = (a == NULL) ? MODE_YUV : MODE_YUVA;
  }

  idec = WebPINewDecoder(NULL);
  if (idec == NULL) return NULL;

  idec->output_.colorspace = colorspace;
  idec->output_.is_external_memory = is_external_memory;
  idec->output_.u.YUVA.y = luma;
  idec->output_.u.YUVA.y_stride = luma_stride;
  idec->output_.u.YUVA.y_size = luma_size;
  idec->output_.u.YUVA.u = u;
  idec->output_.u.YUVA.u_stride = u_stride;
  idec->output_.u.YUVA.u_size = u_size;
  idec->output_.u.YUVA.v = v;
  idec->output_.u.YUVA.v_stride = v_stride;
  idec->output_.u.YUVA.v_size = v_size;
  idec->output_.u.YUVA.a = a;
  idec->output_.u.YUVA.a_stride = a_stride;
  idec->output_.u.YUVA.a_size = a_size;
  return idec;
}